

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::Sdk::Login(string *login_id)

{
  Sdk *this;
  __type _Var1;
  ostream *poVar2;
  PropertiesNode properties_node;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  ObjectNode local_48;
  
  if (instance_ != (Sdk *)0x0) {
    if (0xff < login_id->_M_string_length) {
      poVar2 = std::operator<<((ostream *)&std::cout,"loginId:");
      poVar2 = std::operator<<(poVar2,(string *)login_id);
      poVar2 = std::operator<<(poVar2,"is beyond the maximum length 255");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    _Var1 = std::operator==(&instance_->distinct_id_,login_id);
    this = instance_;
    if (!_Var1) {
      local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header;
      local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_48._vptr_ObjectNode = (_func_int **)&PTR_SetList_00125d50;
      local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_48.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string((string *)&local_68,"track_signup",&local_89);
      std::__cxx11::string::string((string *)&local_88,"$SignUp",&local_8a);
      AddEvent(this,&local_68,&local_88,&local_48,login_id,&instance_->distinct_id_);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::_M_assign((string *)&instance_->distinct_id_);
      instance_->is_login_id_ = true;
      Notify();
      utils::ObjectNode::~ObjectNode(&local_48);
    }
  }
  return;
}

Assistant:

void Sdk::Login(const string &login_id) {
  if (instance_) {

      if (login_id.length() > 255) {
          cout << "loginId:" << login_id << "is beyond the maximum length 255" << endl;
          return;
      }

      if (instance_->distinct_id_ == login_id) {
          return;
      }

    PropertiesNode properties_node;
    instance_->AddEvent("track_signup",
                        "$SignUp",
                        properties_node,
                        login_id,
                        instance_->distinct_id_);
    instance_->distinct_id_ = login_id;
    instance_->is_login_id_ = true;

      instance_->Notify();
  }
}